

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::JunitReporter::OutputTestCases(JunitReporter *this,XmlWriter *xml,Stats *stats)

{
  string *psVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer stats_00;
  string stdOut;
  string stdErr;
  ScopedElement scoped_1;
  ScopedElement e;
  ScopedElement scoped;
  string local_b0;
  string local_90;
  ScopedElement local_70;
  ScopedElement local_68;
  string local_60;
  pointer local_40;
  JunitReporter *local_38;
  
  stats_00 = (stats->m_testCaseStats).
             super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (stats->m_testCaseStats).
             super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (stats_00 != local_40) {
    local_38 = this;
    do {
      paVar3 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"testcase","");
      local_68.m_writer = xml;
      XmlWriter::startElement(xml,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"classname","");
      XmlWriter::writeAttribute(xml,&local_b0,&stats_00->m_className);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"name","");
      XmlWriter::writeAttribute(xml,&local_b0,&stats_00->m_name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"time","");
      XmlWriter::writeAttribute<char[4]>(xml,&local_b0,(char (*) [4])"tbd");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      OutputTestResult(local_38,xml,stats_00);
      psVar1 = &stats_00->m_stdOut;
      lVar2 = std::__cxx11::string::find_first_not_of((char *)psVar1,0x14f414,0);
      std::__cxx11::string::find_last_not_of((char *)psVar1,0x14f414,0xffffffffffffffff);
      if (lVar2 == -1) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        local_b0._M_string_length = 0;
        local_b0.field_2._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)psVar1);
        if (local_b0._M_string_length != 0) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"system-out","");
          local_60._M_dataplus._M_p = &xml->m_tagIsOpen;
          XmlWriter::startElement(xml,&local_90);
          XmlWriter::writeText((XmlWriter *)local_60._M_dataplus._M_p,&local_b0,false);
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
        }
      }
      psVar1 = &stats_00->m_stdErr;
      lVar2 = std::__cxx11::string::find_first_not_of((char *)psVar1,0x14f414,0);
      std::__cxx11::string::find_last_not_of((char *)psVar1,0x14f414,0xffffffffffffffff);
      if (lVar2 == -1) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::substr((ulong)&local_90,(ulong)psVar1);
        if (local_90._M_string_length != 0) {
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"system-err","");
          local_70.m_writer = xml;
          XmlWriter::startElement(xml,&local_60);
          XmlWriter::writeText(local_70.m_writer,&local_90,false);
          XmlWriter::ScopedElement::~ScopedElement(&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      XmlWriter::ScopedElement::~ScopedElement(&local_68);
      stats_00 = stats_00 + 1;
    } while (stats_00 != local_40);
  }
  return;
}

Assistant:

void OutputTestCases( XmlWriter& xml, const Stats& stats ) {
            std::vector<TestCaseStats>::const_iterator it = stats.m_testCaseStats.begin();
            std::vector<TestCaseStats>::const_iterator itEnd = stats.m_testCaseStats.end();
            for(; it != itEnd; ++it ) {

                XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
                xml.writeAttribute( "classname", it->m_className );
                xml.writeAttribute( "name", it->m_name );
                xml.writeAttribute( "time", "tbd" );

                OutputTestResult( xml, *it );

                std::string stdOut = trim( it->m_stdOut );
                if( !stdOut.empty() )
                    xml.scopedElement( "system-out" ).writeText( stdOut, false );
                std::string stdErr = trim( it->m_stdErr );
                if( !stdErr.empty() )
                    xml.scopedElement( "system-err" ).writeText( stdErr, false );
            }
        }